

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

void device_reset_k053260(void *chip)

{
  long lVar1;
  
  *(undefined4 *)((long)chip + 8) = 0;
  *(undefined2 *)((long)chip + 0xc) = 0;
  for (lVar1 = 0x18; lVar1 != 0xb8; lVar1 = lVar1 + 0x28) {
    *(undefined8 *)((long)chip + lVar1) = 0;
    ((undefined8 *)((long)chip + lVar1))[1] = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x10) = 0;
  }
  *(undefined8 *)((long)chip + 200) = 0;
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}